

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>
__thiscall
duckdb::StandardColumnData::CreateCheckpointState
          (StandardColumnData *this,RowGroup *row_group,PartialBlockManager *partial_block_manager)

{
  _func_int **pp_Var1;
  _func_int *in_RCX;
  
  pp_Var1 = (_func_int **)operator_new(0x98);
  pp_Var1[1] = (_func_int *)partial_block_manager;
  pp_Var1[2] = (_func_int *)row_group;
  *(undefined1 *)(pp_Var1 + 4) = 1;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)&PTR__SegmentTree_02448168;
  pp_Var1[0xd] = (_func_int *)0x0;
  pp_Var1[0xe] = (_func_int *)0x0;
  pp_Var1[0xf] = (_func_int *)0x0;
  pp_Var1[0x10] = (_func_int *)0x0;
  pp_Var1[0x11] = in_RCX;
  *pp_Var1 = (_func_int *)&PTR__StandardColumnCheckpointState_02448610;
  pp_Var1[0x12] = (_func_int *)0x0;
  (this->super_ColumnData)._vptr_ColumnData = pp_Var1;
  return (unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
          )(unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
            )this;
}

Assistant:

unique_ptr<ColumnCheckpointState>
StandardColumnData::CreateCheckpointState(RowGroup &row_group, PartialBlockManager &partial_block_manager) {
	return make_uniq<StandardColumnCheckpointState>(row_group, *this, partial_block_manager);
}